

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.h
# Opt level: O1

void __thiscall vm_bif_entry_t::link_to_image(vm_bif_entry_t *this,ushort set_idx)

{
  vm_bif_desc *pvVar1;
  vm_bif_desc *pvVar2;
  ushort uVar3;
  ulong uVar4;
  
  (*this->attach)();
  if (this->func_count != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      pvVar1 = this->func;
      pvVar1[uVar4].bifptr.typ = VM_BIFPTR;
      pvVar1[uVar4].bifptr.val.prop = set_idx;
      pvVar1[uVar4].bifptr.val.bifptr.func_idx = uVar3 - 1;
      pvVar1 = this->func;
      pvVar2 = pvVar1 + uVar4;
      pvVar2->synth_hdr[0] = '\0';
      pvVar2->synth_hdr[1] = '\0';
      pvVar2->synth_hdr[2] = '\0';
      pvVar2->synth_hdr[3] = '\0';
      pvVar2->synth_hdr[4] = '\0';
      pvVar2->synth_hdr[5] = '\0';
      pvVar2->synth_hdr[6] = '\0';
      pvVar2->synth_hdr[7] = '\0';
      pvVar1[uVar4].synth_hdr[8] = '\0';
      pvVar1[uVar4].synth_hdr[9] = '\0';
      pvVar1[uVar4].synth_hdr[0] = (pvVar1[uVar4].varargs != 0) << 7 | (byte)pvVar1[uVar4].min_argc;
      pvVar1[uVar4].synth_hdr[1] = (char)pvVar1[uVar4].opt_argc;
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < this->func_count);
  }
  return;
}

Assistant:

void link_to_image(VMG_ ushort set_idx)
    {
        /* initialize the function set */
        (*attach)(vmg0_);

        /* link each function entry */
        for (ushort i = 0 ; i < func_count ; ++i)
        {
            /* set up the bifptr value for the function */
            func[i].bifptr.set_bifptr(set_idx, i);

            /* generate the synthetic method header for the function */
            func[i].init_synth_hdr();
        }
    }